

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_1::RetrieveOptionsAssumingRightPool
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  pointer ppFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference ppFVar7;
  string *psVar8;
  int local_1ec;
  int local_1d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string name;
  Printer printer;
  string tmp;
  string fieldval;
  int j;
  int iStack_50;
  bool repeated;
  int count;
  int i;
  undefined1 local_40 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *option_entries_local;
  Message *options_local;
  int depth_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(option_entries);
  iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x16])();
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar4);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_40);
  (**(code **)(*fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x80))
            (fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,options,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_40);
  for (iStack_50 = 0;
      sVar6 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)local_40), (ulong)(long)iStack_50 < sVar6; iStack_50 = iStack_50 + 1) {
    j = 1;
    ppFVar7 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)local_40,(long)iStack_50);
    bVar2 = FieldDescriptor::is_repeated(*ppFVar7);
    ppFVar1 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (bVar2) {
      ppFVar7 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)local_40,(long)iStack_50);
      j = (**(code **)(*ppFVar1 + 0x30))(ppFVar1,options,*ppFVar7);
    }
    for (fieldval.field_2._12_4_ = 0; (int)fieldval.field_2._12_4_ < j;
        fieldval.field_2._12_4_ = fieldval.field_2._12_4_ + 1) {
      std::__cxx11::string::string((string *)(tmp.field_2._M_local_buf + 8));
      ppFVar7 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)local_40,(long)iStack_50);
      CVar5 = FieldDescriptor::cpp_type(*ppFVar7);
      if (CVar5 == CPPTYPE_MESSAGE) {
        std::__cxx11::string::string
                  ((string *)
                   &printer.custom_printers_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        TextFormat::Printer::Printer((Printer *)((long)&name.field_2 + 8));
        TextFormat::Printer::SetInitialIndentLevel((Printer *)((long)&name.field_2 + 8),depth + 1);
        ppFVar7 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)local_40,(long)iStack_50);
        if (bVar2) {
          local_1d4 = fieldval.field_2._12_4_;
        }
        else {
          local_1d4 = -1;
        }
        TextFormat::Printer::PrintFieldValueToString
                  ((Printer *)((long)&name.field_2 + 8),options,*ppFVar7,local_1d4,
                   (string *)
                   &printer.custom_printers_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::append(tmp.field_2._M_local_buf + 8);
        std::__cxx11::string::append((string *)(tmp.field_2._M_local_buf + 8));
        std::__cxx11::string::append((ulong)((long)&tmp.field_2 + 8),(char)depth * '\x02');
        std::__cxx11::string::append(tmp.field_2._M_local_buf + 8);
        TextFormat::Printer::~Printer((Printer *)((long)&name.field_2 + 8));
        std::__cxx11::string::~string
                  ((string *)
                   &printer.custom_printers_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ppFVar7 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)local_40,(long)iStack_50);
        if (bVar2) {
          local_1ec = fieldval.field_2._12_4_;
        }
        else {
          local_1ec = -1;
        }
        TextFormat::PrintFieldValueToString
                  (options,*ppFVar7,local_1ec,(string *)((long)&tmp.field_2 + 8));
      }
      std::__cxx11::string::string((string *)local_110);
      ppFVar7 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)local_40,(long)iStack_50);
      bVar3 = FieldDescriptor::is_extension(*ppFVar7);
      if (bVar3) {
        ppFVar7 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)local_40,(long)iStack_50);
        psVar8 = FieldDescriptor::full_name_abi_cxx11_(*ppFVar7);
        std::operator+(&local_150,"(.",psVar8);
        std::operator+(&local_130,&local_150,")");
        std::__cxx11::string::operator=((string *)local_110,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
      }
      else {
        ppFVar7 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)local_40,(long)iStack_50);
        psVar8 = FieldDescriptor::name_abi_cxx11_(*ppFVar7);
        std::__cxx11::string::operator=((string *)local_110,(string *)psVar8);
      }
      std::operator+(&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     " = ");
      std::operator+(&local_170,&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&tmp.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(option_entries,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
    }
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(option_entries);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_40);
  return (bool)((bVar2 ^ 0xffU) & 1);
}

Assistant:

bool RetrieveOptionsAssumingRightPool(int depth, const Message& options,
                                      std::vector<string>* option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (int i = 0; i < fields.size(); i++) {
    int count = 1;
    bool repeated = false;
    if (fields[i]->is_repeated()) {
      count = reflection->FieldSize(options, fields[i]);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      string fieldval;
      if (fields[i]->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        string tmp;
        TextFormat::Printer printer;
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, fields[i],
                                        repeated ? j : -1, &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, fields[i],
                                            repeated ? j : -1, &fieldval);
      }
      string name;
      if (fields[i]->is_extension()) {
        name = "(." + fields[i]->full_name() + ")";
      } else {
        name = fields[i]->name();
      }
      option_entries->push_back(name + " = " + fieldval);
    }
  }
  return !option_entries->empty();
}